

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O0

void ON_aStringHeader_DecrementRefCountAndDeleteIfZero(ON_aStringHeader *hdr)

{
  __int_type _Var1;
  int ref_count;
  ON_aStringHeader *hdr_local;
  
  if (((hdr != (ON_aStringHeader *)0x0) && (hdr != pEmptyStringHeader)) &&
     (_Var1 = std::__atomic_base<int>::operator--((__atomic_base<int> *)hdr), _Var1 == 0)) {
    hdr->string_length = 0;
    hdr->string_capacity = 0;
    onfree(hdr);
  }
  return;
}

Assistant:

static void ON_aStringHeader_DecrementRefCountAndDeleteIfZero(class ON_aStringHeader* hdr)
{
  if (nullptr == hdr || hdr == pEmptyStringHeader)
    return;
  //const int ref_count = ON_AtomicDecrementInt32(&hdr->ref_count);
  const int ref_count = --hdr->ref_count;
  if (0 == ref_count)
  {
    // zero entire header to help prevent crashes from corrupt string bug
    hdr->string_length = 0;
    hdr->string_capacity = 0;
    onfree(hdr);
  }
}